

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.cpp
# Opt level: O2

int main(void)

{
  ssize_t sVar1;
  ostream *poVar2;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  char *pcVar3;
  float fVar4;
  Aio aio;
  
  signal(2,sig_handler);
  pcVar3 = (char *)0x0;
  mraa::Aio::Aio(&aio,0);
  __buf = extraout_RDX;
  while (flag != 0) {
    sVar1 = mraa::Aio::read(&aio,(int)pcVar3,__buf,in_RCX);
    fVar4 = mraa::Aio::readFloat(&aio);
    poVar2 = std::operator<<((ostream *)&std::cout,"ADC A0 read %X - %d");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)sVar1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)sVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "ADC A0 read float - %.5f";
    poVar2 = std::operator<<((ostream *)&std::cout,"ADC A0 read float - %.5f");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
    __buf = extraout_RDX_00;
  }
  mraa::Aio::~Aio(&aio);
  return 0;
}

Assistant:

int
main(void)
{
    uint16_t value;
    float float_value;

    signal(SIGINT, sig_handler);

    //! [Interesting]
    /* initialize AIO */
    mraa::Aio aio(AIO_PORT);

    while (flag) {
        value = aio.read();
        float_value = aio.readFloat();
        std::cout << "ADC A0 read %X - %d" << value << value << std::endl;
        std::cout << "ADC A0 read float - %.5f" << float_value << std::endl;
    }
    //! [Interesting]

    return EXIT_SUCCESS;
}